

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXBinaryTokenizer.cpp
# Opt level: O0

uint Assimp::FBX::anon_unknown_3::ReadString
               (char **sbegin_out,char **send_out,char *input,char **cursor,char *end,
               bool long_length,bool allow_null)

{
  byte bVar1;
  size_t sVar2;
  uint32_t local_e4;
  allocator<char> local_b9;
  string local_b8;
  uint local_98;
  allocator<char> local_91;
  uint i;
  uint32_t local_70;
  uint32_t length;
  allocator<char> local_59;
  string local_58;
  uint local_38;
  byte local_32;
  byte local_31;
  uint32_t len_len;
  bool allow_null_local;
  bool long_length_local;
  char *end_local;
  char **cursor_local;
  char *input_local;
  char **send_out_local;
  char **sbegin_out_local;
  
  local_32 = allow_null;
  local_38 = 1;
  if (long_length) {
    local_38 = 4;
  }
  local_31 = long_length;
  _len_len = end;
  end_local = (char *)cursor;
  cursor_local = (char **)input;
  input_local = (char *)send_out;
  send_out_local = sbegin_out;
  sVar2 = Offset(*cursor,end);
  if (sVar2 < local_38) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"cannot ReadString, out of bounds reading length",&local_59);
    TokenizeError(&local_58,(char *)cursor_local,*(char **)end_local);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  if ((local_31 & 1) == 0) {
    bVar1 = ReadByte((char *)cursor_local,(char **)end_local,_len_len);
    local_e4 = (uint32_t)bVar1;
  }
  else {
    local_e4 = ReadWord((char *)cursor_local,(char **)end_local,_len_len);
  }
  local_70 = local_e4;
  sVar2 = Offset(*(char **)end_local,_len_len);
  if (sVar2 < local_70) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i,"cannot ReadString, length is out of bounds",&local_91);
    TokenizeError((string *)&i,(char *)cursor_local,*(char **)end_local);
    std::__cxx11::string::~string((string *)&i);
    std::allocator<char>::~allocator(&local_91);
  }
  *send_out_local = *(char **)end_local;
  *(ulong *)end_local = *(long *)end_local + (ulong)local_70;
  *(undefined8 *)input_local = *(undefined8 *)end_local;
  if ((local_32 & 1) == 0) {
    for (local_98 = 0; local_98 < local_70; local_98 = local_98 + 1) {
      if ((*send_out_local)[local_98] == '\0') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"failed ReadString, unexpected NUL character in string",
                   &local_b9);
        TokenizeError(&local_b8,(char *)cursor_local,*(char **)end_local);
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator(&local_b9);
      }
    }
  }
  return local_70;
}

Assistant:

unsigned int ReadString(const char*& sbegin_out, const char*& send_out, const char* input,
        const char*& cursor, const char* end, bool long_length = false, bool allow_null = false) {
    const uint32_t len_len = long_length ? 4 : 1;
    if(Offset(cursor, end) < len_len) {
        TokenizeError("cannot ReadString, out of bounds reading length",input, cursor);
    }

    const uint32_t length = long_length ? ReadWord(input, cursor, end) : ReadByte(input, cursor, end);

    if (Offset(cursor, end) < length) {
        TokenizeError("cannot ReadString, length is out of bounds",input, cursor);
    }

    sbegin_out = cursor;
    cursor += length;

    send_out = cursor;

    if(!allow_null) {
        for (unsigned int i = 0; i < length; ++i) {
            if(sbegin_out[i] == '\0') {
                TokenizeError("failed ReadString, unexpected NUL character in string",input, cursor);
            }
        }
    }

    return length;
}